

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::member_attribute_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  StorageClass SVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  ExecutionModel EVar6;
  SPIREntryPoint *pSVar7;
  size_type sVar8;
  CompilerError *pCVar9;
  SPIRType *pSVar10;
  ulong uVar11;
  char *pcVar12;
  byte bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char (*in_R8) [4];
  char (*in_stack_ffffffffffffff28) [4];
  BuiltIn builtin;
  allocator local_c1;
  string loc_qual;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  SPIRType *local_38;
  
  pSVar7 = Compiler::get_entry_point((Compiler *)this);
  local_38 = Compiler::get<spirv_cross::SPIRType>
                       ((Compiler *)this,
                        (type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id
                       );
  builtin = BuiltInMax;
  bVar2 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
  bVar3 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationResourceIndexPrimary);
  if (bVar3) {
    uVar4 = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationResourceIndexPrimary);
    loc_qual._M_dataplus._M_p._0_4_ = uVar4;
    join<char_const(&)[7],unsigned_int,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)" [[id(",(char (*) [7])&loc_qual,
               (uint *)0x27e75d,(char (*) [2])in_R8);
    uVar4 = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationInterfaceOrigID);
    loc_qual._M_dataplus._M_p._0_4_ = uVar4;
    sVar8 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                    (key_type *)&loc_qual);
    if (sVar8 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if ((pSVar7->model == ExecutionModelVertex) && (type->storage == StorageClassInput)) {
    if (bVar2) {
      if ((((ulong)builtin < 0x2c) && ((0xc0000000060U >> ((ulong)builtin & 0x3f) & 1) != 0)) ||
         (builtin - BuiltInBaseVertex < 2)) {
        if ((this->msl_options).vertex_for_tessellation != true) {
          ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
          builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
          ::std::operator+(&loc_qual,&local_98,&local_78);
          ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
          goto LAB_001f22c4;
        }
      }
      else if (builtin == BuiltInDrawIndex) {
        pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar9,"DrawIndex is not supported in MSL.");
        goto LAB_001f3175;
      }
      goto switchD_001f2371_caseD_2;
    }
    uVar4 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
    if (uVar4 == 0xffffffff) goto LAB_001f22e2;
    ::std::__cxx11::string::string((string *)&local_98," [[attribute(",(allocator *)&local_58);
    ::std::__cxx11::to_string(&local_78,uVar4);
    ::std::operator+(&loc_qual,&local_98,&local_78);
    ::std::operator+(__return_storage_ptr__,&loc_qual,")]]");
    goto LAB_001f22c4;
  }
LAB_001f22e2:
  bVar3 = is_mesh_shader(this);
  bVar13 = 1;
  if ((!bVar3) && (bVar3 = is_tese_shader(this), !bVar3)) {
    if (pSVar7->model == ExecutionModelVertex) {
      bVar13 = (this->msl_options).vertex_for_tessellation ^ 1;
      goto LAB_001f2323;
    }
    if (type->storage != StorageClassOutput) {
      bVar13 = 0;
      goto LAB_001f232d;
    }
LAB_001f2437:
    bVar3 = is_tesc_shader(this);
    if ((bVar3) && (type->storage == StorageClassInput)) {
      if (bVar2) {
        if (builtin - BuiltInPrimitiveId < 2) {
          if ((this->msl_options).multi_patch_workgroup == true) goto LAB_001f303b;
          ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
          builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
          ::std::operator+(&local_98,&local_78,&local_58);
          ::std::operator+(&loc_qual,&local_98,"]]");
          pcVar12 = " ";
          if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            pcVar12 = "";
          }
          ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar12);
        }
        else {
          if (builtin == BuiltInPatchVertices) goto LAB_001f303b;
          if ((builtin != BuiltInSubgroupSize) && (builtin != BuiltInSubgroupLocalInvocationId)) {
            if ((this->msl_options).multi_patch_workgroup != false) goto LAB_001f303b;
            in_R8 = (char (*) [4])0x0;
            uVar5 = get_or_allocate_builtin_input_member_location
                              (this,builtin,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
            goto LAB_001f2561;
          }
          if ((this->msl_options).emulate_subgroups == true) goto LAB_001f303b;
          ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
          builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
          ::std::operator+(&local_98,&local_78,&local_58);
          ::std::operator+(&loc_qual,&local_98,"]]");
          pcVar12 = " ";
          if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            pcVar12 = "";
          }
          ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar12);
        }
        goto LAB_001f2873;
      }
      if ((this->msl_options).multi_patch_workgroup == true) goto LAB_001f303b;
      uVar5 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
LAB_001f2561:
      if (uVar5 != 0xffffffff) {
        ::std::__cxx11::string::string((string *)&local_98," [[attribute(",(allocator *)&local_58);
        ::std::__cxx11::to_string(&local_78,uVar5);
        ::std::operator+(&loc_qual,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&loc_qual,")]]");
        goto LAB_001f22c4;
      }
    }
    bVar3 = is_tesc_shader(this);
    if ((bVar3) && (type->storage == StorageClassOutput)) {
LAB_001f25d5:
      if (bVar2) {
        get_or_allocate_builtin_output_member_location
                  (this,builtin,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      }
      goto LAB_001f303b;
    }
    bVar3 = is_tese_shader(this);
    SVar1 = type->storage;
    if (SVar1 == StorageClassInput && bVar3) {
      if (bVar2) {
        if (builtin != BuiltInPrimitiveId) {
          if (builtin == BuiltInPatchVertices) goto LAB_001f303b;
          if (builtin != BuiltInTessCoord) goto LAB_001f26f4;
        }
        ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
        builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
        ::std::operator+(&loc_qual,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
      }
      else {
LAB_001f26f4:
        if (((this->msl_options).raw_buffer_tese_input == true) ||
           (pSVar10 = Compiler::get_type((Compiler *)this,
                                         (TypeID)(type->member_types).
                                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                                 .ptr[index].id),
           pSVar10->basetype == ControlPointArray)) goto LAB_001f303b;
        if (bVar2) {
          in_R8 = (char (*) [4])0x0;
          uVar5 = get_or_allocate_builtin_input_member_location
                            (this,builtin,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
        }
        else {
          uVar5 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
        }
        if (uVar5 == 0xffffffff) {
          SVar1 = type->storage;
          goto LAB_001f2ad2;
        }
        ::std::__cxx11::string::string((string *)&local_98," [[attribute(",(allocator *)&local_58);
        ::std::__cxx11::to_string(&local_78,uVar5);
        ::std::operator+(&loc_qual,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&loc_qual,")]]");
      }
LAB_001f22c4:
      ::std::__cxx11::string::~string((string *)&loc_qual);
      ::std::__cxx11::string::~string((string *)&local_78);
      this_00 = &local_98;
      goto LAB_001f2899;
    }
LAB_001f2ad2:
    EVar6 = pSVar7->model;
    if (SVar1 == StorageClassInput && EVar6 == ExecutionModelFragment) {
      loc_qual._M_dataplus._M_p = (pointer)&loc_qual.field_2;
      loc_qual._M_string_length = 0;
      loc_qual.field_2._M_local_buf[0] = '\0';
      if (!bVar2) {
        member_location_attribute_qualifier_abi_cxx11_(&local_98,this,type,index);
LAB_001f2b8d:
        ::std::__cxx11::string::operator=((string *)&loc_qual,(string *)&local_98);
        ::std::__cxx11::string::~string((string *)&local_98);
        goto LAB_001f2bab;
      }
      if (builtin < (BuiltInSampleMask|BuiltInPointSize)) {
        if ((0x178200U >> (builtin & BuiltInGlobalSize) & 1) != 0) goto LAB_001f2b80;
        if (builtin == BuiltInClipDistance) {
          local_98._M_dataplus._M_p._0_4_ =
               Compiler::get_member_decoration
                         ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                          DecorationIndex);
          join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                    (__return_storage_ptr__,(spirv_cross *)" [[user(clip",(char (*) [13])&local_98,
                     (uint *)")]]",in_R8);
        }
        else {
          if (builtin != BuiltInCullDistance) goto LAB_001f2b71;
          local_98._M_dataplus._M_p._0_4_ =
               Compiler::get_member_decoration
                         ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                          DecorationIndex);
          join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                    (__return_storage_ptr__,(spirv_cross *)" [[user(cull",(char (*) [13])&local_98,
                     (uint *)")]]",in_R8);
        }
      }
      else {
LAB_001f2b71:
        if (builtin - BuiltInBaryCoordKHR < 2) {
LAB_001f2b80:
          builtin_qualifier_abi_cxx11_(&local_98,this,builtin);
          goto LAB_001f2b8d;
        }
        if (builtin == BuiltInViewIndex) {
          if ((this->msl_options).multiview == true) {
            if ((this->msl_options).multiview_layered_rendering == true) goto LAB_001f2b80;
            goto LAB_001f2bab;
          }
        }
        else {
LAB_001f2bab:
          if ((builtin == BuiltInBaryCoordKHR) &&
             (bVar3 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationNoPerspective), bVar3)) {
            pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar9,"NoPerspective decorations are not supported for BaryCoord inputs.");
            goto LAB_001f31a5;
          }
        }
        if ((7 < local_38->basetype - SByte) && (!bVar2 || builtin != BuiltInFragCoord)) {
          bVar3 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationFlat);
          if (bVar3) {
            if (loc_qual._M_string_length != 0) {
              ::std::__cxx11::string::append((char *)&loc_qual);
            }
          }
          else {
            bVar3 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                               DecorationCentroid);
            if (bVar3) {
              if (loc_qual._M_string_length != 0) {
                ::std::__cxx11::string::append((char *)&loc_qual);
              }
              if ((builtin & ~BuiltInPointSize) == BuiltInBaryCoordKHR) {
                pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                CompilerError::CompilerError
                          (pCVar9,"Centroid interpolation not supported for barycentrics in MSL.");
LAB_001f31a5:
                __cxa_throw(pCVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationNoPerspective);
            }
            else {
              bVar3 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationSample);
              if (bVar3) {
                if (loc_qual._M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)&loc_qual);
                }
                if ((builtin & ~BuiltInPointSize) == BuiltInBaryCoordKHR) {
                  pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                  CompilerError::CompilerError
                            (pCVar9,"Sample interpolation not supported for barycentrics in MSL.");
                  goto LAB_001f31a5;
                }
                Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationNoPerspective);
              }
              else {
                bVar3 = Compiler::has_member_decoration
                                  ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                   DecorationNoPerspective);
                if (bVar3 || builtin == BuiltInBaryCoordNoPerspKHR) {
                  if (loc_qual._M_string_length != 0) {
                    ::std::__cxx11::string::append((char *)&loc_qual);
                  }
                }
                else {
                  if (builtin != BuiltInBaryCoordKHR) goto LAB_001f2d3a;
                  if (loc_qual._M_string_length != 0) {
                    ::std::__cxx11::string::append((char *)&loc_qual);
                  }
                }
              }
            }
          }
          ::std::__cxx11::string::append((char *)&loc_qual);
        }
LAB_001f2d3a:
        if (loc_qual._M_string_length == 0) {
          ::std::__cxx11::string::~string((string *)&loc_qual);
          EVar6 = pSVar7->model;
          SVar1 = type->storage;
          goto LAB_001f2d99;
        }
        ::std::operator+(&local_98," [[",&loc_qual);
        ::std::operator+(__return_storage_ptr__,&local_98,"]]");
        ::std::__cxx11::string::~string((string *)&local_98);
      }
LAB_001f2414:
      this_00 = &loc_qual;
      goto LAB_001f2899;
    }
LAB_001f2d99:
    if ((EVar6 == ExecutionModelFragment) && (SVar1 == StorageClassOutput)) {
      if (!bVar2) {
        uVar4 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
        loc_qual._M_dataplus._M_p._0_4_ = uVar4;
        if (uVar4 == 0xffffffff) {
          bVar2 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationIndex);
          if (bVar2) {
            local_98._M_dataplus._M_p._0_4_ =
                 Compiler::get_member_decoration
                           ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                            DecorationIndex);
            join<char_const(&)[10],unsigned_int,char_const(&)[4]>
                      (__return_storage_ptr__,(spirv_cross *)" [[index(",(char (*) [10])&local_98,
                       (uint *)")]]",in_R8);
            return __return_storage_ptr__;
          }
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_98)
          ;
          return __return_storage_ptr__;
        }
        if (((this->msl_options).enable_frag_output_mask >> (uVar4 & 0x1f) & 1) != 0) {
          bVar2 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationIndex);
          if (bVar2) {
            local_98._M_dataplus._M_p._0_4_ =
                 Compiler::get_member_decoration
                           ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                            DecorationIndex);
            join<char_const(&)[10],unsigned_int&,char_const(&)[10],unsigned_int,char_const(&)[4]>
                      (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&loc_qual,
                       (uint *)"), index(",(char (*) [10])&local_98,(uint *)")]]",
                       in_stack_ffffffffffffff28);
            return __return_storage_ptr__;
          }
          join<char_const(&)[10],unsigned_int&,char_const(&)[4]>
                    (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&loc_qual,
                     (uint *)")]]",in_R8);
          return __return_storage_ptr__;
        }
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_98);
        return __return_storage_ptr__;
      }
      if (builtin == BuiltInSampleMask) {
LAB_001f2fd8:
        ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
        builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
        ::std::operator+(&loc_qual,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
        goto LAB_001f22c4;
      }
      if (builtin == BuiltInFragDepth) {
        if ((this->msl_options).enable_frag_depth_builtin != false) goto LAB_001f2fd8;
      }
      else if ((builtin == BuiltInFragStencilRefEXT) &&
              ((this->msl_options).enable_frag_stencil_ref_builtin != false)) {
        if ((this->msl_options).msl_version < 0x4e84) {
          pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar9,"Stencil export only supported in MSL 2.1 and up.");
LAB_001f3175:
          __cxa_throw(pCVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
        builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
        ::std::operator+(&loc_qual,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
        goto LAB_001f22c4;
      }
    }
    else if (((bVar2 && (SVar1 == StorageClassInput && EVar6 == ExecutionModelGLCompute)) &&
             (uVar11 = (ulong)builtin, uVar11 < 0x2a)) &&
            (((0x3d000000UL >> (uVar11 & 0x3f) & 1) != 0 ||
             (((0x35000000000U >> (uVar11 & 0x3f) & 1) != 0 &&
              ((this->msl_options).emulate_subgroups == false)))))) {
      ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
      ::std::operator+(&loc_qual,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
      goto LAB_001f22c4;
    }
    goto switchD_001f2371_caseD_2;
  }
LAB_001f2323:
  if (type->storage != StorageClassOutput) {
LAB_001f232d:
    bVar3 = is_mesh_shader(this);
    if (bVar3) goto LAB_001f233d;
LAB_001f2428:
    if (((pSVar7->model != ExecutionModelVertex) ||
        ((this->msl_options).vertex_for_tessellation != true)) ||
       (type->storage != StorageClassOutput)) goto LAB_001f2437;
    goto LAB_001f25d5;
  }
LAB_001f233d:
  if (bVar13 == 0) goto LAB_001f2428;
  if (!bVar2) {
    member_location_attribute_qualifier_abi_cxx11_(&loc_qual,this,type,index);
    if (loc_qual._M_string_length == 0) {
      ::std::__cxx11::string::~string((string *)&loc_qual);
      goto LAB_001f2428;
    }
    join<char_const(&)[4],std::__cxx11::string&,char_const(&)[3]>
              (__return_storage_ptr__,(spirv_cross *)" [[",(char (*) [4])&loc_qual,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x294e6a,
               (char (*) [3])in_R8);
    goto LAB_001f2414;
  }
  switch(builtin) {
  case BuiltInPosition:
  case BuiltInPrimitiveId:
  case BuiltInLayer:
    break;
  case BuiltInPointSize:
    if ((this->msl_options).enable_point_size_builtin == true) {
      ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
      ::std::operator+(&loc_qual,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
      goto LAB_001f22c4;
    }
  case 2:
  case BuiltInVertexId:
  case BuiltInInstanceId:
  case BuiltInInvocationId:
switchD_001f2371_caseD_2:
LAB_001f303b:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&loc_qual);
    return __return_storage_ptr__;
  case BuiltInClipDistance:
    bVar2 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex
                      );
    if (bVar2) {
      uVar4 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationIndex);
      loc_qual._M_dataplus._M_p._0_4_ = uVar4;
      pcVar12 = " [[user(clip";
LAB_001f2915:
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)pcVar12,(char (*) [13])&loc_qual,
                 (uint *)")]]",in_R8);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
    builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
    ::std::operator+(&local_98,&local_78,&local_58);
    ::std::operator+(&loc_qual,&local_98,"]]");
    pcVar12 = " ";
    if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pcVar12 = "";
    }
    ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar12);
    goto LAB_001f2873;
  case BuiltInCullDistance:
    bVar2 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationIndex
                      );
    if (bVar2) {
      uVar4 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationIndex);
      loc_qual._M_dataplus._M_p._0_4_ = uVar4;
      pcVar12 = " [[user(cull";
      goto LAB_001f2915;
    }
    ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
    builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
    ::std::operator+(&local_98,&local_78,&local_58);
    ::std::operator+(&loc_qual,&local_98,"]]");
    pcVar12 = " ";
    if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      pcVar12 = "";
    }
    ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar12);
    goto LAB_001f2873;
  case BuiltInViewportIndex:
    if ((this->msl_options).msl_version < 20000) {
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar9,"ViewportIndex requires Metal 2.0.");
      goto LAB_001f3175;
    }
    break;
  default:
    if ((builtin != BuiltInPrimitiveShadingRateKHR) && (builtin != BuiltInCullPrimitiveEXT))
    goto switchD_001f2371_caseD_2;
  }
  ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
  builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
  ::std::operator+(&local_98,&local_78,&local_58);
  ::std::operator+(&loc_qual,&local_98,"]]");
  pcVar12 = " ";
  if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    pcVar12 = "";
  }
  ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar12);
LAB_001f2873:
  ::std::__cxx11::string::~string((string *)&loc_qual);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_58);
  this_00 = &local_78;
LAB_001f2899:
  ::std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::member_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	auto &execution = get_entry_point();

	uint32_t mbr_type_id = type.member_types[index];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(type, index, &builtin);

	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
	{
		string quals = join(
		    " [[id(", get_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary), ")");
		if (interlocked_resources.count(
		        get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID)))
			quals += ", raster_order_group(0)";
		quals += "]]";
		return quals;
	}

	// Vertex function inputs
	if (execution.model == ExecutionModelVertex && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInVertexId:
			case BuiltInVertexIndex:
			case BuiltInBaseVertex:
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
			case BuiltInBaseInstance:
				if (msl_options.vertex_for_tessellation)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInDrawIndex:
				SPIRV_CROSS_THROW("DrawIndex is not supported in MSL.");

			default:
				return "";
			}
		}

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	bool use_semantic_stage_output = is_mesh_shader() || is_tese_shader() ||
	                                 (execution.model == ExecutionModelVertex && !msl_options.vertex_for_tessellation);

	// Vertex, mesh and tessellation evaluation function outputs
	if ((type.storage == StorageClassOutput || is_mesh_shader()) && use_semantic_stage_output)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPointSize:
				// Only mark the PointSize builtin if really rendering points.
				// Some shaders may include a PointSize builtin even when used to render
				// non-point topologies, and Metal will reject this builtin when compiling
				// the shader into a render pipeline that uses a non-point topology.
				return msl_options.enable_point_size_builtin ? (string(" [[") + builtin_qualifier(builtin) + "]]") : "";

			case BuiltInViewportIndex:
				if (!msl_options.supports_msl_version(2, 0))
					SPIRV_CROSS_THROW("ViewportIndex requires Metal 2.0.");
				/* fallthrough */
			case BuiltInPosition:
			case BuiltInLayer:
			case BuiltInCullPrimitiveEXT:
			case BuiltInPrimitiveShadingRateKHR:
			case BuiltInPrimitiveId:
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInClipDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInCullDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			default:
				return "";
			}
		}
		string loc_qual = member_location_attribute_qualifier(type, index);
		if (!loc_qual.empty())
			return join(" [[", loc_qual, "]]");
	}

	if (execution.model == ExecutionModelVertex && msl_options.vertex_for_tessellation && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation control function inputs
	if (is_tesc_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInInvocationId:
			case BuiltInPrimitiveId:
				if (msl_options.multi_patch_workgroup)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}
		if (msl_options.multi_patch_workgroup)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation control function outputs
	if (is_tesc_shader() && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation evaluation function inputs
	if (is_tese_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPrimitiveId:
			case BuiltInTessCoord:
				return string(" [[") + builtin_qualifier(builtin) + "]]";
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}

		if (msl_options.raw_buffer_tese_input)
			return "";

		// The special control point array must not be marked with an attribute.
		if (get_type(type.member_types[index]).basetype == SPIRType::ControlPointArray)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation evaluation function outputs were handled above.

	// Fragment function inputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassInput)
	{
		string quals;
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInViewIndex:
				if (!msl_options.multiview || !msl_options.multiview_layered_rendering)
					break;
				/* fallthrough */
			case BuiltInFrontFacing:
			case BuiltInPointCoord:
			case BuiltInFragCoord:
			case BuiltInSampleId:
			case BuiltInSampleMask:
			case BuiltInLayer:
			case BuiltInBaryCoordKHR:
			case BuiltInBaryCoordNoPerspKHR:
				quals = builtin_qualifier(builtin);
				break;

			case BuiltInClipDistance:
				return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
			case BuiltInCullDistance:
				return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");

			default:
				break;
			}
		}
		else
			quals = member_location_attribute_qualifier(type, index);

		if (builtin == BuiltInBaryCoordKHR && has_member_decoration(type.self, index, DecorationNoPerspective))
		{
			// NoPerspective is baked into the builtin type.
			SPIRV_CROSS_THROW("NoPerspective decorations are not supported for BaryCoord inputs.");
		}

		// Don't bother decorating integers with the 'flat' attribute; it's
		// the default (in fact, the only option). Also don't bother with the
		// FragCoord builtin; it's always noperspective on Metal.
		if (!type_is_integral(mbr_type) && (!is_builtin || builtin != BuiltInFragCoord))
		{
			if (has_member_decoration(type.self, index, DecorationFlat))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "flat";
			}
			else if (has_member_decoration(type.self, index, DecorationCentroid))
			{
				if (!quals.empty())
					quals += ", ";

				if (builtin == BuiltInBaryCoordNoPerspKHR || builtin == BuiltInBaryCoordKHR)
					SPIRV_CROSS_THROW("Centroid interpolation not supported for barycentrics in MSL.");

				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "centroid_no_perspective";
				else
					quals += "centroid_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationSample))
			{
				if (!quals.empty())
					quals += ", ";

				if (builtin == BuiltInBaryCoordNoPerspKHR || builtin == BuiltInBaryCoordKHR)
					SPIRV_CROSS_THROW("Sample interpolation not supported for barycentrics in MSL.");

				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "sample_no_perspective";
				else
					quals += "sample_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationNoPerspective) || builtin == BuiltInBaryCoordNoPerspKHR)
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_no_perspective";
			}
			else if (builtin == BuiltInBaryCoordKHR)
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_perspective";
			}
		}

		if (!quals.empty())
			return " [[" + quals + "]]";
	}

	// Fragment function outputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInFragStencilRefEXT:
				// Similar to PointSize, only mark FragStencilRef if there's a stencil buffer.
				// Some shaders may include a FragStencilRef builtin even when used to render
				// without a stencil attachment, and Metal will reject this builtin
				// when compiling the shader into a render pipeline that does not set
				// stencilAttachmentPixelFormat.
				if (!msl_options.enable_frag_stencil_ref_builtin)
					return "";
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Stencil export only supported in MSL 2.1 and up.");
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInFragDepth:
				// Ditto FragDepth.
				if (!msl_options.enable_frag_depth_builtin)
					return "";
				/* fallthrough */
			case BuiltInSampleMask:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
		uint32_t locn = get_member_location(type.self, index);
		// Metal will likely complain about missing color attachments, too.
		if (locn != k_unknown_location && !(msl_options.enable_frag_output_mask & (1 << locn)))
			return "";
		if (locn != k_unknown_location && has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[color(", locn, "), index(", get_member_decoration(type.self, index, DecorationIndex),
			            ")]]");
		else if (locn != k_unknown_location)
			return join(" [[color(", locn, ")]]");
		else if (has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[index(", get_member_decoration(type.self, index, DecorationIndex), ")]]");
		else
			return "";
	}

	// Compute function inputs
	if (execution.model == ExecutionModelGLCompute && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInNumSubgroups:
			case BuiltInSubgroupId:
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					break;
				/* fallthrough */
			case BuiltInGlobalInvocationId:
			case BuiltInWorkgroupId:
			case BuiltInNumWorkgroups:
			case BuiltInLocalInvocationId:
			case BuiltInLocalInvocationIndex:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
	}

	return "";
}